

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

void jinit_d_coef_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  code *pcVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  int in_ESI;
  long in_RDI;
  int i;
  JBLOCKROW buffer;
  jpeg_component_info *compptr;
  int access_rows;
  int ci;
  my_coef_ptr_conflict coef;
  int local_34;
  long local_28;
  int local_20;
  int local_1c;
  
  puVar2 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0xe8);
  *(undefined8 **)(in_RDI + 0x230) = puVar2;
  *puVar2 = start_input_pass;
  puVar2[2] = start_output_pass;
  puVar2[0x1c] = 0;
  if (in_ESI == 0) {
    lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,1,0x500);
    for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
      puVar2[(long)local_34 + 7] = lVar6 + (long)local_34 * 0x80;
    }
    puVar2[1] = dummy_consume_data;
    puVar2[3] = decompress_onepass;
    puVar2[4] = 0;
  }
  else {
    local_1c = 0;
    local_28 = *(long *)(in_RDI + 0x130);
    for (; local_1c < *(int *)(in_RDI + 0x38); local_1c = local_1c + 1) {
      local_20 = *(int *)(local_28 + 0xc);
      if (*(int *)(in_RDI + 0x138) != 0) {
        local_20 = local_20 * 5;
      }
      pcVar1 = *(code **)(*(long *)(in_RDI + 8) + 0x28);
      uVar3 = jround_up((ulong)*(uint *)(local_28 + 0x1c),(long)*(int *)(local_28 + 8));
      uVar4 = jround_up((ulong)*(uint *)(local_28 + 0x20),(long)*(int *)(local_28 + 0xc));
      uVar5 = (*pcVar1)(in_RDI,1,1,uVar3 & 0xffffffff,uVar4 & 0xffffffff,local_20);
      puVar2[(long)local_1c + 0x12] = uVar5;
      local_28 = local_28 + 0x60;
    }
    puVar2[1] = consume_data;
    puVar2[3] = decompress_data;
    puVar2[4] = puVar2 + 0x12;
  }
  uVar5 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x80);
  puVar2[0x11] = uVar5;
  return;
}

Assistant:

GLOBAL(void)
jinit_d_coef_controller(j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_coef_controller));
  cinfo->coef = (struct jpeg_d_coef_controller *)coef;
  coef->pub.start_input_pass = start_input_pass;
  coef->pub.start_output_pass = start_output_pass;
#ifdef BLOCK_SMOOTHING_SUPPORTED
  coef->coef_bits_latch = NULL;
#endif

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    /* Note we ask for a pre-zeroed array. */
    int ci, access_rows;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      access_rows = compptr->v_samp_factor;
#ifdef BLOCK_SMOOTHING_SUPPORTED
      /* If block smoothing could be used, need a bigger window */
      if (cinfo->progressive_mode)
        access_rows *= 5;
#endif
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE, TRUE,
         (JDIMENSION)jround_up((long)compptr->width_in_blocks,
                               (long)compptr->h_samp_factor),
         (JDIMENSION)jround_up((long)compptr->height_in_blocks,
                               (long)compptr->v_samp_factor),
         (JDIMENSION)access_rows);
    }
    coef->pub.consume_data = consume_data;
    coef->pub.decompress_data = decompress_data;
    coef->pub.coef_arrays = coef->whole_image; /* link to virtual arrays */
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  D_MAX_BLOCKS_IN_MCU * sizeof(JBLOCK));
    for (i = 0; i < D_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->pub.consume_data = dummy_consume_data;
    coef->pub.decompress_data = decompress_onepass;
    coef->pub.coef_arrays = NULL; /* flag for no virtual arrays */
  }

  /* Allocate the workspace buffer */
  coef->workspace = (JCOEF *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(JCOEF) * DCTSIZE2);
}